

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece.pb.cc
# Opt level: O3

void __thiscall
sentencepiece::SentencePieceText_SentencePiece::InternalSwap
          (SentencePieceText_SentencePiece *this,SentencePieceText_SentencePiece *other)

{
  InternalMetadata *this_00;
  uint32 uVar1;
  uint32 uVar2;
  uint32 uVar3;
  uint uVar4;
  string *psVar5;
  void *pvVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  void *pvVar8;
  
  google::protobuf::internal::ExtensionSet::Swap(&this->_extensions_,&other->_extensions_);
  this_00 = &(this->super_MessageLite)._internal_metadata_;
  pvVar6 = (this->super_MessageLite)._internal_metadata_.ptr_;
  pvVar8 = (other->super_MessageLite)._internal_metadata_.ptr_;
  if (((ulong)pvVar6 & 1) == 0) {
    if (((ulong)pvVar8 & 1) != 0) goto LAB_001ad6ea;
    uVar1 = (this->_has_bits_).has_bits_[0];
    (this->_has_bits_).has_bits_[0] = (other->_has_bits_).has_bits_[0];
    (other->_has_bits_).has_bits_[0] = uVar1;
  }
  else {
    if (((ulong)pvVar8 & 1) == 0) {
      google::protobuf::internal::InternalMetadata::
      mutable_unknown_fields_slow<std::__cxx11::string>
                (&(other->super_MessageLite)._internal_metadata_);
      pvVar6 = this_00->ptr_;
    }
LAB_001ad6ea:
    if (((ulong)pvVar6 & 1) == 0) {
      pbVar7 = google::protobuf::internal::InternalMetadata::
               mutable_unknown_fields_slow<std::__cxx11::string>(this_00);
    }
    else {
      pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (((ulong)pvVar6 & 0xfffffffffffffffe) + 8);
    }
    std::__cxx11::string::swap((string *)pbVar7);
    pvVar8 = (this->super_MessageLite)._internal_metadata_.ptr_;
    uVar1 = (this->_has_bits_).has_bits_[0];
    (this->_has_bits_).has_bits_[0] = (other->_has_bits_).has_bits_[0];
    (other->_has_bits_).has_bits_[0] = uVar1;
    pvVar6 = pvVar8;
    if (((ulong)pvVar8 & 1) != 0) {
      pvVar6 = *(void **)((ulong)pvVar8 & 0xfffffffffffffffe);
      uVar4 = 1;
      goto LAB_001ad728;
    }
  }
  uVar4 = 0;
  pvVar8 = pvVar6;
LAB_001ad728:
  if (((undefined8 *)(this->piece_).tagged_ptr_.ptr_ !=
       &google::protobuf::internal::fixed_address_empty_string) ||
     ((undefined8 *)(other->piece_).tagged_ptr_.ptr_ !=
      &google::protobuf::internal::fixed_address_empty_string)) {
    psVar5 = google::protobuf::internal::ArenaStringPtr::Mutable_abi_cxx11_(&this->piece_,pvVar6);
    google::protobuf::internal::ArenaStringPtr::Mutable_abi_cxx11_(&other->piece_,pvVar6);
    std::__cxx11::string::swap((string *)psVar5);
    pvVar8 = this_00->ptr_;
    uVar4 = (uint)pvVar8 & 1;
  }
  if (uVar4 != 0) {
    pvVar8 = *(void **)((ulong)pvVar8 & 0xfffffffffffffffe);
  }
  if (((undefined8 *)(this->surface_).tagged_ptr_.ptr_ !=
       &google::protobuf::internal::fixed_address_empty_string) ||
     ((undefined8 *)(other->surface_).tagged_ptr_.ptr_ !=
      &google::protobuf::internal::fixed_address_empty_string)) {
    psVar5 = google::protobuf::internal::ArenaStringPtr::Mutable_abi_cxx11_(&this->surface_,pvVar8);
    google::protobuf::internal::ArenaStringPtr::Mutable_abi_cxx11_(&other->surface_,pvVar8);
    std::__cxx11::string::swap((string *)psVar5);
  }
  uVar2 = this->id_;
  uVar3 = this->begin_;
  uVar1 = other->begin_;
  this->id_ = other->id_;
  this->begin_ = uVar1;
  other->id_ = uVar2;
  other->begin_ = uVar3;
  uVar1 = this->end_;
  this->end_ = other->end_;
  other->end_ = uVar1;
  return;
}

Assistant:

void SentencePieceText_SentencePiece::InternalSwap(SentencePieceText_SentencePiece* other) {
  using std::swap;
  _extensions_.Swap(&other->_extensions_);
  _internal_metadata_.Swap<std::string>(&other->_internal_metadata_);
  swap(_has_bits_[0], other->_has_bits_[0]);
  piece_.Swap(&other->piece_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
  surface_.Swap(&other->surface_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
  ::PROTOBUF_NAMESPACE_ID::internal::memswap<
      PROTOBUF_FIELD_OFFSET(SentencePieceText_SentencePiece, end_)
      + sizeof(SentencePieceText_SentencePiece::end_)
      - PROTOBUF_FIELD_OFFSET(SentencePieceText_SentencePiece, id_)>(
          reinterpret_cast<char*>(&id_),
          reinterpret_cast<char*>(&other->id_));
}